

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkNullCoalescingPriority(CheckerVisitor *this,BinExpr *expr)

{
  bool bVar1;
  TreeOp TVar2;
  Node *this_00;
  Node *this_01;
  char *pcVar3;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  Expr *r;
  Expr *l;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    this_00 = &BinExpr::lhs(in_RSI)->super_Node;
    this_01 = &BinExpr::rhs(in_RSI)->super_Node;
    TVar2 = Node::op((Node *)in_RSI);
    if (TVar2 == TO_NULLC) {
      TVar2 = Node::op(this_00);
      bVar1 = isSuspiciousNeighborOfNullCoalescing(TVar2);
      if (bVar1) {
        TVar2 = Node::op(this_00);
        pcVar3 = treeopStr(TVar2);
        report(in_RDI,this_00,0x5b,pcVar3);
      }
      TVar2 = Node::op(this_01);
      bVar1 = isSuspiciousNeighborOfNullCoalescing(TVar2);
      if (bVar1) {
        TVar2 = Node::op(this_01);
        pcVar3 = treeopStr(TVar2);
        report(in_RDI,this_01,0x5b,pcVar3);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkNullCoalescingPriority(const BinExpr *expr) {
  if (effectsOnly)
    return;

  const Expr *l = expr->lhs();
  const Expr *r = expr->rhs();

  if (expr->op() == TO_NULLC) {
    if (isSuspiciousNeighborOfNullCoalescing(l->op())) {
      report(l, DiagnosticsId::DI_NULL_COALESCING_PRIORITY, treeopStr(l->op()));
    }

    if (isSuspiciousNeighborOfNullCoalescing(r->op())) {
      report(r, DiagnosticsId::DI_NULL_COALESCING_PRIORITY, treeopStr(r->op()));
    }
  }
}